

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O1

int ffmnam(fitsfile *fptr,char *oldname,char *newname,int *status)

{
  int iVar1;
  char value [71];
  char comm [73];
  char card [81];
  char acStack_118 [80];
  char local_c8 [80];
  char local_78 [88];
  
  if (0 < *status) {
    return *status;
  }
  iVar1 = ffgkey(fptr,oldname,acStack_118,local_c8,status);
  if (iVar1 < 1) {
    ffmkky(newname,acStack_118,local_c8,local_78,status);
    ffmkey(fptr,local_78,status);
  }
  return *status;
}

Assistant:

int ffmnam(fitsfile *fptr,     /* I - FITS file pointer     */
           const char *oldname,/* I - existing keyword name */
           const char *newname,/* I - new name for keyword  */
           int *status)        /* IO - error status         */
{
    char comm[FLEN_COMMENT];
    char value[FLEN_VALUE];
    char card[FLEN_CARD];
 
    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (ffgkey(fptr, oldname, value, comm, status) > 0)
        return(*status);

    ffmkky(newname, value, comm, card, status);  /* construct the card */
    ffmkey(fptr, card, status);  /* rewrite with new name */

    return(*status);
}